

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall Wasm::WasmBytecodeGenerator::PrintOpBegin(WasmBytecodeGenerator *this,WasmOp op)

{
  uint uVar1;
  WasmType type;
  uint32 uVar2;
  uint uVar3;
  char16 *pcVar4;
  WasmBinaryReader *pWVar5;
  WasmFunctionInfo *pWVar6;
  ulong uVar7;
  char16_t *pcVar8;
  WasmBlock WVar9;
  
  uVar2 = this->opId;
  if (this->lastOpId == uVar2) {
    Output::Print(L"\r\n");
    uVar2 = this->opId;
  }
  this->opId = uVar2 + 1;
  this->lastOpId = uVar2 + 1;
  uVar1 = (this->m_blockInfos).list.
          super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count - 1;
  if (0 < (int)uVar1) {
    Output::SkipToColumn((ulong)uVar1);
  }
  uVar1 = (uint)op;
  if (uVar1 < 0xfd00) {
    switch(op) {
    case wbUnreachable:
      pcVar8 = L"Unreachable";
      break;
    case wbNop:
      pcVar8 = L"Nop";
      break;
    case wbBlock:
      pcVar4 = L"Block";
      goto LAB_00f19f2b;
    case wbLoop:
      pcVar4 = L"Loop";
      goto LAB_00f19f2b;
    case wbIf:
      pcVar4 = L"If";
LAB_00f19f2b:
      Output::Print(pcVar4);
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
        if ((pWVar5->super_WasmReaderBase).m_currentNode.field_1.block.isSingleResult == false)
        goto LAB_00f19f82;
      }
      else if ((pWVar5->super_WasmReaderBase).m_currentNode.field_1.block.isSingleResult != true) {
LAB_00f19f82:
        uVar2 = WasmBlock::GetSignatureId
                          (&(pWVar5->super_WasmReaderBase).m_currentNode.field_1.block);
LAB_00f19f90:
        PrintOpBegin::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this,uVar2);
        goto switchD_00f1aa73_caseD_f;
      }
      type = WasmBlock::GetSingleResult(&(pWVar5->super_WasmReaderBase).m_currentNode.field_1.block)
      ;
      pcVar4 = WasmTypes::GetTypeName(type);
      Output::Print(L" () -> %s",pcVar4);
      goto switchD_00f1aa73_caseD_f;
    case wbElse:
      pcVar8 = L"Else";
      break;
    case wbIf|wbBlock:
    case wbIf|wbLoop:
    case 8:
    case 9:
    case 10:
    case wbCall|wbBlock:
    case wbCall|wbLoop:
    case wbCall|wbIf:
    case wbCall|wbElse:
    case wbCall|wbIf|wbBlock:
    case wbCall|wbIf|wbLoop:
    case 0x18:
    case 0x19:
    case wbCall|wbBr:
    case wbCall|wbBrIf:
    case wbCall|wbBrTable:
    case wbCall|wbReturn:
    case wbSetGlobal|wbNop:
    case wbSetGlobal|wbBlock:
    case wbSetGlobal|wbLoop:
switchD_00f1949d_caseD_fd01:
      if (0xfe0f < uVar1) {
        if (0x3e < uVar1 - 0xfe10) goto switchD_00f1aa73_caseD_f;
        goto switchD_00f1aa73_caseD_28;
      }
      switch(op) {
      case wbBr:
      case wbBrIf:
        goto switchD_00f1aa73_caseD_c;
      case wbBrTable:
        goto switchD_00f1aa73_caseD_e;
      case wbReturn:
      case wbCall|wbBlock:
      case wbCall|wbLoop:
      case wbCall|wbIf:
      case wbCall|wbElse:
      case wbCall|wbIf|wbBlock:
      case wbCall|wbIf|wbLoop:
      case 0x18:
      case 0x19:
      case wbDrop:
      case wbSelect:
      case wbCall|wbBr:
      case wbCall|wbBrIf:
      case wbCall|wbBrTable:
      case wbCall|wbReturn:
      case wbSetGlobal|wbNop:
      case wbSetGlobal|wbBlock:
      case wbSetGlobal|wbLoop:
      case wbMemorySize:
      case wbMemoryGrow:
        goto switchD_00f1aa73_caseD_f;
      case wbCall:
        goto switchD_00f1aa73_caseD_10;
      case wbCallIndirect:
        goto switchD_00f1aa73_caseD_11;
      case wbGetLocal:
      case wbSetLocal:
      case wbTeeLocal:
      case wbGetGlobal:
      case wbSetGlobal:
        goto switchD_00f1aa73_caseD_20;
      case wbI32LoadMem:
      case wbI64LoadMem:
      case wbF32LoadMem:
      case wbF64LoadMem:
      case wbI32LoadMem8S:
      case wbI32LoadMem8U:
      case wbI32LoadMem16S:
      case wbI32LoadMem16U:
      case wbI64LoadMem8S:
      case wbI64LoadMem8U:
      case wbI64LoadMem16S:
      case wbI64LoadMem16U:
      case wbI64LoadMem32S:
      case wbI64LoadMem32U:
      case wbI32StoreMem:
      case wbI64StoreMem:
      case wbF32StoreMem:
      case wbF64StoreMem:
      case wbI32StoreMem8:
      case wbI32StoreMem16:
      case wbI64StoreMem8:
      case wbI64StoreMem16:
      case wbI64StoreMem32:
        break;
      case wbI32Const:
        goto switchD_00f1aa73_caseD_41;
      case wbI64Const:
        goto switchD_00f1aa73_caseD_42;
      case wbF32Const:
        goto switchD_00f1aa73_caseD_43;
      case wbF64Const:
        goto switchD_00f1aa73_caseD_44;
      default:
        if ((uVar1 != 0xfd00) && (uVar1 != 0xfd0b)) goto switchD_00f1aa73_caseD_f;
      }
      goto switchD_00f1aa73_caseD_28;
    case wbEnd:
      pcVar8 = L"End";
      break;
    case wbBr:
      pcVar8 = L"Br";
      goto LAB_00f19752;
    case wbBrIf:
      pcVar8 = L"BrIf";
LAB_00f19752:
      Output::Print(pcVar8);
switchD_00f1aa73_caseD_c:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar7 = (ulong)(pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      pcVar8 = L" depth: %u";
      goto LAB_00f1a861;
    case wbBrTable:
      Output::Print(L"BrTable");
switchD_00f1aa73_caseD_e:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar3 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      uVar1 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget;
      pcVar8 = L" %u cases, default: %u";
      goto LAB_00f1a890;
    case wbReturn:
      pcVar8 = L"Return";
      break;
    case wbCall:
      Output::Print(L"Call");
switchD_00f1aa73_caseD_10:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar1 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      uVar2 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
      if (uVar1 < uVar2) {
        pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
        if (pWVar5 == (WasmBinaryReader *)0x0) {
          pWVar5 = (this->m_module->m_reader).ptr;
        }
        uVar3 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.call.funcType + Function;
        if (uVar3 < 4) {
          pcVar8 = (char16_t *)(&DAT_011c934c + *(int *)(&DAT_011c934c + (ulong)uVar3 * 4));
        }
        else {
          pcVar8 = L" (unknown)";
        }
        Output::Print(pcVar8);
        pWVar6 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,uVar1);
        Js::FunctionBody::DumpFullFunctionName((pWVar6->m_body).ptr);
        goto switchD_00f1aa73_caseD_f;
      }
      pcVar8 = L" invalid id %u";
      uVar7 = (ulong)uVar1;
      goto LAB_00f1a861;
    case wbCallIndirect:
      Output::Print(L"CallIndirect");
switchD_00f1aa73_caseD_11:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar2 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      goto LAB_00f19f90;
    case wbDrop:
      pcVar8 = L"Drop";
      break;
    case wbSelect:
      pcVar8 = L"Select";
      break;
    case wbGetLocal:
      pcVar8 = L"GetLocal";
      goto LAB_00f19ef0;
    case wbSetLocal:
      pcVar8 = L"SetLocal";
      goto LAB_00f19ef0;
    case wbTeeLocal:
      pcVar8 = L"TeeLocal";
      goto LAB_00f19ef0;
    case wbGetGlobal:
      pcVar8 = L"GetGlobal";
      goto LAB_00f19ef0;
    case wbSetGlobal:
      pcVar8 = L"SetGlobal";
LAB_00f19ef0:
      Output::Print(pcVar8);
switchD_00f1aa73_caseD_20:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar7 = (ulong)(pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      pcVar8 = L" (%d)";
LAB_00f1a861:
      Output::Print(pcVar8,uVar7);
      goto switchD_00f1aa73_caseD_f;
    case wbI32LoadMem:
      pcVar8 = L"I32LoadMem";
      goto LAB_00f1a7df;
    case wbI64LoadMem:
      pcVar8 = L"I64LoadMem";
      goto LAB_00f1a7df;
    case wbF32LoadMem:
      pcVar8 = L"F32LoadMem";
      goto LAB_00f1a7df;
    case wbF64LoadMem:
      pcVar8 = L"F64LoadMem";
      goto LAB_00f1a7df;
    case wbI32LoadMem8S:
      pcVar8 = L"I32LoadMem8S";
      goto LAB_00f1a7df;
    case wbI32LoadMem8U:
      pcVar8 = L"I32LoadMem8U";
      goto LAB_00f1a7df;
    case wbI32LoadMem16S:
      pcVar8 = L"I32LoadMem16S";
      goto LAB_00f1a7df;
    case wbI32LoadMem16U:
      pcVar8 = L"I32LoadMem16U";
      goto LAB_00f1a7df;
    case wbI64LoadMem8S:
      pcVar8 = L"I64LoadMem8S";
      goto LAB_00f1a7df;
    case wbI64LoadMem8U:
      pcVar8 = L"I64LoadMem8U";
      goto LAB_00f1a7df;
    case wbI64LoadMem16S:
      pcVar8 = L"I64LoadMem16S";
      goto LAB_00f1a7df;
    case wbI64LoadMem16U:
      pcVar8 = L"I64LoadMem16U";
      goto LAB_00f1a7df;
    case wbI64LoadMem32S:
      pcVar8 = L"I64LoadMem32S";
      goto LAB_00f1a7df;
    case wbI64LoadMem32U:
      pcVar8 = L"I64LoadMem32U";
      goto LAB_00f1a7df;
    case wbI32StoreMem:
      pcVar8 = L"I32StoreMem";
      goto LAB_00f1a7df;
    case wbI64StoreMem:
      pcVar8 = L"I64StoreMem";
      goto LAB_00f1a7df;
    case wbF32StoreMem:
      pcVar8 = L"F32StoreMem";
      goto LAB_00f1a7df;
    case wbF64StoreMem:
      pcVar8 = L"F64StoreMem";
      goto LAB_00f1a7df;
    case wbI32StoreMem8:
      pcVar8 = L"I32StoreMem8";
      goto LAB_00f1a7df;
    case wbI32StoreMem16:
      pcVar8 = L"I32StoreMem16";
      goto LAB_00f1a7df;
    case wbI64StoreMem8:
      pcVar8 = L"I64StoreMem8";
      goto LAB_00f1a7df;
    case wbI64StoreMem16:
      pcVar8 = L"I64StoreMem16";
      goto LAB_00f1a7df;
    case wbI64StoreMem32:
      pcVar8 = L"I64StoreMem32";
      goto LAB_00f1a7df;
    case wbMemorySize:
      pcVar8 = L"MemorySize";
      break;
    case wbMemoryGrow:
      pcVar8 = L"MemoryGrow";
      break;
    case wbI32Const:
      Output::Print(L"I32Const");
switchD_00f1aa73_caseD_41:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      uVar1 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
      pcVar8 = L" (%d, 0x%x)";
      uVar3 = uVar1;
LAB_00f1a890:
      Output::Print(pcVar8,(ulong)uVar3,(ulong)uVar1);
      goto switchD_00f1aa73_caseD_f;
    case wbI64Const:
      Output::Print(L"I64Const");
switchD_00f1aa73_caseD_42:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      Output::Print(L" (%lld, 0x%llx)",(pWVar5->super_WasmReaderBase).m_currentNode.field_1.block);
      goto switchD_00f1aa73_caseD_f;
    case wbF32Const:
      Output::Print(L"F32Const");
switchD_00f1aa73_caseD_43:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      WVar9 = (WasmBlock)(double)*(float *)&(pWVar5->super_WasmReaderBase).m_currentNode.field_1;
      goto LAB_00f19c3b;
    case wbF64Const:
      Output::Print(L"F64Const");
switchD_00f1aa73_caseD_44:
      pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
      if (pWVar5 == (WasmBinaryReader *)0x0) {
        pWVar5 = (this->m_module->m_reader).ptr;
      }
      WVar9 = (pWVar5->super_WasmReaderBase).m_currentNode.field_1.block;
LAB_00f19c3b:
      Output::Print(L" (%.4f)",WVar9);
      goto switchD_00f1aa73_caseD_f;
    case wbI32Eqz:
      pcVar8 = L"I32Eqz";
      break;
    case wbI32Eq:
      pcVar8 = L"I32Eq";
      break;
    case wbI32Ne:
      pcVar8 = L"I32Ne";
      break;
    case wbI32LtS:
      pcVar8 = L"I32LtS";
      break;
    case wbI32LtU:
      pcVar8 = L"I32LtU";
      break;
    case wbI32GtS:
      pcVar8 = L"I32GtS";
      break;
    case wbI32GtU:
      pcVar8 = L"I32GtU";
      break;
    case wbI32LeS:
      pcVar8 = L"I32LeS";
      break;
    case wbI32LeU:
      pcVar8 = L"I32LeU";
      break;
    case wbI32GeS:
      pcVar8 = L"I32GeS";
      break;
    case wbI32GeU:
      pcVar8 = L"I32GeU";
      break;
    case wbI64Eqz:
      pcVar8 = L"I64Eqz";
      break;
    case wbI64Eq:
      pcVar8 = L"I64Eq";
      break;
    case wbI64Ne:
      pcVar8 = L"I64Ne";
      break;
    case wbI64LtS:
      pcVar8 = L"I64LtS";
      break;
    case wbI64LtU:
      pcVar8 = L"I64LtU";
      break;
    case wbI64GtS:
      pcVar8 = L"I64GtS";
      break;
    case wbI64GtU:
      pcVar8 = L"I64GtU";
      break;
    case wbI64LeS:
      pcVar8 = L"I64LeS";
      break;
    case wbI64LeU:
      pcVar8 = L"I64LeU";
      break;
    case wbI64GeS:
      pcVar8 = L"I64GeS";
      break;
    case wbI64GeU:
      pcVar8 = L"I64GeU";
      break;
    case wbF32Eq:
      pcVar8 = L"F32Eq";
      break;
    case wbF32Ne:
      pcVar8 = L"F32Ne";
      break;
    case wbF32Lt:
      pcVar8 = L"F32Lt";
      break;
    case wbF32Gt:
      pcVar8 = L"F32Gt";
      break;
    case wbF32Le:
      pcVar8 = L"F32Le";
      break;
    case wbF32Ge:
      pcVar8 = L"F32Ge";
      break;
    case wbF64Eq:
      pcVar8 = L"F64Eq";
      break;
    case wbF64Ne:
      pcVar8 = L"F64Ne";
      break;
    case wbF64Lt:
      pcVar8 = L"F64Lt";
      break;
    case wbF64Gt:
      pcVar8 = L"F64Gt";
      break;
    case wbF64Le:
      pcVar8 = L"F64Le";
      break;
    case wbF64Ge:
      pcVar8 = L"F64Ge";
      break;
    case wbI32Clz:
      pcVar8 = L"I32Clz";
      break;
    case wbI32Ctz:
      pcVar8 = L"I32Ctz";
      break;
    case wbI32Popcnt:
      pcVar8 = L"I32Popcnt";
      break;
    case wbI32Add:
      pcVar8 = L"I32Add";
      break;
    case wbI32Sub:
      pcVar8 = L"I32Sub";
      break;
    case wbI32Mul:
      pcVar8 = L"I32Mul";
      break;
    case wbI32DivS:
      pcVar8 = L"I32DivS";
      break;
    case wbI32DivU:
      pcVar8 = L"I32DivU";
      break;
    case wbI32RemS:
      pcVar8 = L"I32RemS";
      break;
    case wbI32RemU:
      pcVar8 = L"I32RemU";
      break;
    case wbI32And:
      pcVar8 = L"I32And";
      break;
    case wbI32Or:
      pcVar8 = L"I32Or";
      break;
    case wbI32Xor:
      pcVar8 = L"I32Xor";
      break;
    case wbI32Shl:
      pcVar8 = L"I32Shl";
      break;
    case wbI32ShrS:
      pcVar8 = L"I32ShrS";
      break;
    case wbI32ShrU:
      pcVar8 = L"I32ShrU";
      break;
    case wbI32Rol:
      pcVar8 = L"I32Rol";
      break;
    case wbI32Ror:
      pcVar8 = L"I32Ror";
      break;
    case wbI64Clz:
      pcVar8 = L"I64Clz";
      break;
    case wbI64Ctz:
      pcVar8 = L"I64Ctz";
      break;
    case wbI64Popcnt:
      pcVar8 = L"I64Popcnt";
      break;
    case wbI64Add:
      pcVar8 = L"I64Add";
      break;
    case wbI64Sub:
      pcVar8 = L"I64Sub";
      break;
    case wbI64Mul:
      pcVar8 = L"I64Mul";
      break;
    case wbI64DivS:
      pcVar8 = L"I64DivS";
      break;
    case wbI64DivU:
      pcVar8 = L"I64DivU";
      break;
    case wbI64RemS:
      pcVar8 = L"I64RemS";
      break;
    case wbI64RemU:
      pcVar8 = L"I64RemU";
      break;
    case wbI64And:
      pcVar8 = L"I64And";
      break;
    case wbI64Or:
      pcVar8 = L"I64Or";
      break;
    case wbI64Xor:
      pcVar8 = L"I64Xor";
      break;
    case wbI64Shl:
      pcVar8 = L"I64Shl";
      break;
    case wbI64ShrS:
      pcVar8 = L"I64ShrS";
      break;
    case wbI64ShrU:
      pcVar8 = L"I64ShrU";
      break;
    case wbI64Rol:
      pcVar8 = L"I64Rol";
      break;
    case wbI64Ror:
      pcVar8 = L"I64Ror";
      break;
    case wbF32Abs:
      pcVar8 = L"F32Abs";
      break;
    case wbF32Neg:
      pcVar8 = L"F32Neg";
      break;
    case wbF32Ceil:
      pcVar8 = L"F32Ceil";
      break;
    case wbF32Floor:
      pcVar8 = L"F32Floor";
      break;
    case wbF32Trunc:
      pcVar8 = L"F32Trunc";
      break;
    case wbF32NearestInt:
      pcVar8 = L"F32NearestInt";
      break;
    case wbF32Sqrt:
      pcVar8 = L"F32Sqrt";
      break;
    case wbF32Add:
      pcVar8 = L"F32Add";
      break;
    case wbF32Sub:
      pcVar8 = L"F32Sub";
      break;
    case wbF32Mul:
      pcVar8 = L"F32Mul";
      break;
    case wbF32Div:
      pcVar8 = L"F32Div";
      break;
    case wbF32Min:
      pcVar8 = L"F32Min";
      break;
    case wbF32Max:
      pcVar8 = L"F32Max";
      break;
    case wbF32CopySign:
      pcVar8 = L"F32CopySign";
      break;
    case wbF64Abs:
      pcVar8 = L"F64Abs";
      break;
    case wbF64Neg:
      pcVar8 = L"F64Neg";
      break;
    case wbF64Ceil:
      pcVar8 = L"F64Ceil";
      break;
    case wbF64Floor:
      pcVar8 = L"F64Floor";
      break;
    case wbF64Trunc:
      pcVar8 = L"F64Trunc";
      break;
    case wbF64NearestInt:
      pcVar8 = L"F64NearestInt";
      break;
    case wbF64Sqrt:
      pcVar8 = L"F64Sqrt";
      break;
    case wbF64Add:
      pcVar8 = L"F64Add";
      break;
    case wbF64Sub:
      pcVar8 = L"F64Sub";
      break;
    case wbF64Mul:
      pcVar8 = L"F64Mul";
      break;
    case wbF64Div:
      pcVar8 = L"F64Div";
      break;
    case wbF64Min:
      pcVar8 = L"F64Min";
      break;
    case wbF64Max:
      pcVar8 = L"F64Max";
      break;
    case wbF64CopySign:
      pcVar8 = L"F64CopySign";
      break;
    case wbI32Wrap_I64:
      pcVar8 = L"I32Wrap_I64";
      break;
    case wbI32TruncS_F32:
      pcVar8 = L"I32TruncS_F32";
      break;
    case wbI32TruncU_F32:
      pcVar8 = L"I32TruncU_F32";
      break;
    case wbI32TruncS_F64:
      pcVar8 = L"I32TruncS_F64";
      break;
    case wbI32TruncU_F64:
      pcVar8 = L"I32TruncU_F64";
      break;
    case wbI64ExtendS_I32:
      pcVar8 = L"I64ExtendS_I32";
      break;
    case wbI64ExtendU_I32:
      pcVar8 = L"I64ExtendU_I32";
      break;
    case wbI64TruncS_F32:
      pcVar8 = L"I64TruncS_F32";
      break;
    case wbI64TruncU_F32:
      pcVar8 = L"I64TruncU_F32";
      break;
    case wbI64TruncS_F64:
      pcVar8 = L"I64TruncS_F64";
      break;
    case wbI64TruncU_F64:
      pcVar8 = L"I64TruncU_F64";
      break;
    case wbF32SConvertI32:
      pcVar8 = L"F32SConvertI32";
      break;
    case wbF32UConvertI32:
      pcVar8 = L"F32UConvertI32";
      break;
    case wbF32SConvertI64:
      pcVar8 = L"F32SConvertI64";
      break;
    case wbF32UConvertI64:
      pcVar8 = L"F32UConvertI64";
      break;
    case wbF32DemoteF64:
      pcVar8 = L"F32DemoteF64";
      break;
    case wbF64SConvertI32:
      pcVar8 = L"F64SConvertI32";
      break;
    case wbF64UConvertI32:
      pcVar8 = L"F64UConvertI32";
      break;
    case wbF64SConvertI64:
      pcVar8 = L"F64SConvertI64";
      break;
    case wbF64UConvertI64:
      pcVar8 = L"F64UConvertI64";
      break;
    case wbF64PromoteF32:
      pcVar8 = L"F64PromoteF32";
      break;
    case wbI32ReinterpretF32:
      pcVar8 = L"I32ReinterpretF32";
      break;
    case wbI64ReinterpretF64:
      pcVar8 = L"I64ReinterpretF64";
      break;
    case wbF32ReinterpretI32:
      pcVar8 = L"F32ReinterpretI32";
      break;
    case wbF64ReinterpretI64:
      pcVar8 = L"F64ReinterpretI64";
      break;
    case wbI32Extend8_s:
      pcVar8 = L"I32Extend8_s";
      break;
    case wbI32Extend16_s:
      pcVar8 = L"I32Extend16_s";
      break;
    case wbI64Extend8_s:
      pcVar8 = L"I64Extend8_s";
      break;
    case wbI64Extend16_s:
      pcVar8 = L"I64Extend16_s";
      break;
    case wbI64Extend32_s:
      pcVar8 = L"I64Extend32_s";
      break;
    default:
      switch(op) {
      case wbPrintFuncName:
        pcVar8 = L"PrintFuncName";
        break;
      case wbPrintArgSeparator:
        pcVar8 = L"PrintArgSeparator";
        break;
      case wbPrintBeginCall:
        pcVar8 = L"PrintBeginCall";
        break;
      case wbPrintNewLine:
        pcVar8 = L"PrintNewLine";
        break;
      case wbPrintEndCall:
        pcVar8 = L"PrintEndCall";
        break;
      case wbPrintEndCall|wbNop:
      case wbPrintEndCall|wbBlock:
      case wbPrintEndCall|wbLoop:
      case 0xf008:
      case 0xf009:
      case 0xf00a:
      case wbPrintFuncName|wbEnd:
        goto switchD_00f1949d_caseD_fd01;
      case wbPrintI32:
        pcVar8 = L"PrintI32";
        break;
      case wbPrintI64:
        pcVar8 = L"PrintI64";
        break;
      case wbPrintF32:
        pcVar8 = L"PrintF32";
        break;
      case wbPrintF64:
        pcVar8 = L"PrintF64";
        break;
      default:
        switch(op) {
        case wbI32SatTruncS_F32:
          pcVar8 = L"I32SatTruncS_F32";
          break;
        case wbI32SatTruncU_F32:
          pcVar8 = L"I32SatTruncU_F32";
          break;
        case wbI32SatTruncS_F64:
          pcVar8 = L"I32SatTruncS_F64";
          break;
        case wbI32SatTruncU_F64:
          pcVar8 = L"I32SatTruncU_F64";
          break;
        case wbI64SatTruncS_F32:
          pcVar8 = L"I64SatTruncS_F32";
          break;
        case wbI64SatTruncU_F32:
          pcVar8 = L"I64SatTruncU_F32";
          break;
        case wbI64SatTruncS_F64:
          pcVar8 = L"I64SatTruncS_F64";
          break;
        case wbI64SatTruncU_F64:
          pcVar8 = L"I64SatTruncU_F64";
          break;
        default:
          goto switchD_00f1949d_caseD_fd01;
        }
      }
    }
    goto LAB_00f1a834;
  }
  switch(uVar1) {
  case 0xfd00:
    pcVar8 = L"V128Load";
    goto LAB_00f1a7df;
  default:
    goto switchD_00f1949d_caseD_fd01;
  case 0xfd0b:
    pcVar8 = L"V128Store";
    goto LAB_00f1a7df;
  case 0xfd0c:
    pcVar8 = L"V128Const";
    break;
  case 0xfd0d:
    pcVar8 = L"V8X16Shuffle";
    break;
  case 0xfd0f:
    pcVar8 = L"I16Splat";
    break;
  case 0xfd10:
    pcVar8 = L"I8Splat";
    break;
  case 0xfd11:
    pcVar8 = L"I4Splat";
    break;
  case 0xfd12:
    pcVar8 = L"I2Splat";
    break;
  case 0xfd13:
    pcVar8 = L"F4Splat";
    break;
  case 0xfd14:
    pcVar8 = L"F2Splat";
    break;
  case 0xfd15:
    pcVar8 = L"I16ExtractLaneS";
    break;
  case 0xfd16:
    pcVar8 = L"I16ExtractLaneU";
    break;
  case 0xfd17:
    pcVar8 = L"I16ReplaceLane";
    break;
  case 0xfd18:
    pcVar8 = L"I8ExtractLaneS";
    break;
  case 0xfd19:
    pcVar8 = L"I8ExtractLaneU";
    break;
  case 0xfd1a:
    pcVar8 = L"I8ReplaceLane";
    break;
  case 0xfd1b:
    pcVar8 = L"I4ExtractLane";
    break;
  case 0xfd1c:
    pcVar8 = L"I4ReplaceLane";
    break;
  case 0xfd1d:
    pcVar8 = L"I2ExtractLane";
    break;
  case 0xfd1e:
    pcVar8 = L"I2ReplaceLane";
    break;
  case 0xfd1f:
    pcVar8 = L"F4ExtractLane";
    break;
  case 0xfd20:
    pcVar8 = L"F4ReplaceLane";
    break;
  case 0xfd21:
    pcVar8 = L"F2ExtractLane";
    break;
  case 0xfd22:
    pcVar8 = L"F2ReplaceLane";
    break;
  case 0xfd23:
    pcVar8 = L"I16Eq";
    break;
  case 0xfd24:
    pcVar8 = L"I16Ne";
    break;
  case 0xfd25:
    pcVar8 = L"I16LtS";
    break;
  case 0xfd26:
    pcVar8 = L"I16LtU";
    break;
  case 0xfd27:
    pcVar8 = L"I16GtS";
    break;
  case 0xfd28:
    pcVar8 = L"I16GtU";
    break;
  case 0xfd29:
    pcVar8 = L"I16LeS";
    break;
  case 0xfd2a:
    pcVar8 = L"I16LeU";
    break;
  case 0xfd2b:
    pcVar8 = L"I16GeS";
    break;
  case 0xfd2c:
    pcVar8 = L"I16GeU";
    break;
  case 0xfd2d:
    pcVar8 = L"I8Eq";
    break;
  case 0xfd2e:
    pcVar8 = L"I8Ne";
    break;
  case 0xfd2f:
    pcVar8 = L"I8LtS";
    break;
  case 0xfd30:
    pcVar8 = L"I8LtU";
    break;
  case 0xfd31:
    pcVar8 = L"I8GtS";
    break;
  case 0xfd32:
    pcVar8 = L"I8GtU";
    break;
  case 0xfd33:
    pcVar8 = L"I8LeS";
    break;
  case 0xfd34:
    pcVar8 = L"I8LeU";
    break;
  case 0xfd35:
    pcVar8 = L"I8GeS";
    break;
  case 0xfd36:
    pcVar8 = L"I8GeU";
    break;
  case 0xfd37:
    pcVar8 = L"I4Eq";
    break;
  case 0xfd38:
    pcVar8 = L"I4Ne";
    break;
  case 0xfd39:
    pcVar8 = L"I4LtS";
    break;
  case 0xfd3a:
    pcVar8 = L"I4LtU";
    break;
  case 0xfd3b:
    pcVar8 = L"I4GtS";
    break;
  case 0xfd3c:
    pcVar8 = L"I4GtU";
    break;
  case 0xfd3d:
    pcVar8 = L"I4LeS";
    break;
  case 0xfd3e:
    pcVar8 = L"I4LeU";
    break;
  case 0xfd3f:
    pcVar8 = L"I4GeS";
    break;
  case 0xfd40:
    pcVar8 = L"I4GeU";
    break;
  case 0xfd41:
    pcVar8 = L"F4Eq";
    break;
  case 0xfd42:
    pcVar8 = L"F4Ne";
    break;
  case 0xfd43:
    pcVar8 = L"F4Lt";
    break;
  case 0xfd44:
    pcVar8 = L"F4Gt";
    break;
  case 0xfd45:
    pcVar8 = L"F4Le";
    break;
  case 0xfd46:
    pcVar8 = L"F4Ge";
    break;
  case 0xfd47:
    pcVar8 = L"F2Eq";
    break;
  case 0xfd48:
    pcVar8 = L"F2Ne";
    break;
  case 0xfd49:
    pcVar8 = L"F2Lt";
    break;
  case 0xfd4a:
    pcVar8 = L"F2Gt";
    break;
  case 0xfd4b:
    pcVar8 = L"F2Le";
    break;
  case 0xfd4c:
    pcVar8 = L"F2Ge";
    break;
  case 0xfd4d:
    pcVar8 = L"V128Not";
    break;
  case 0xfd4e:
    pcVar8 = L"V128And";
    break;
  case 0xfd50:
    pcVar8 = L"V128Or";
    break;
  case 0xfd51:
    pcVar8 = L"V128Xor";
    break;
  case 0xfd52:
    pcVar8 = L"V128Bitselect";
    break;
  case 0xfd61:
    pcVar8 = L"I16Neg";
    break;
  case 0xfd62:
    pcVar8 = L"I16AnyTrue";
    break;
  case 0xfd63:
    pcVar8 = L"I16AllTrue";
    break;
  case 0xfd6b:
    pcVar8 = L"I16Shl";
    break;
  case 0xfd6c:
    pcVar8 = L"I16ShrS";
    break;
  case 0xfd6d:
    pcVar8 = L"I16ShrU";
    break;
  case 0xfd6e:
    pcVar8 = L"I16Add";
    break;
  case 0xfd6f:
    pcVar8 = L"I16AddSaturateS";
    break;
  case 0xfd70:
    pcVar8 = L"I16AddSaturateU";
    break;
  case 0xfd71:
    pcVar8 = L"I16Sub";
    break;
  case 0xfd72:
    pcVar8 = L"I16SubSaturateS";
    break;
  case 0xfd73:
    pcVar8 = L"I16SubSaturateU";
    break;
  case 0xfd81:
    pcVar8 = L"I8Neg";
    break;
  case 0xfd82:
    pcVar8 = L"I8AnyTrue";
    break;
  case 0xfd83:
    pcVar8 = L"I8AllTrue";
    break;
  case 0xfd8b:
    pcVar8 = L"I8Shl";
    break;
  case 0xfd8c:
    pcVar8 = L"I8ShrS";
    break;
  case 0xfd8d:
    pcVar8 = L"I8ShrU";
    break;
  case 0xfd8e:
    pcVar8 = L"I8Add";
    break;
  case 0xfd8f:
    pcVar8 = L"I8AddSaturateS";
    break;
  case 0xfd90:
    pcVar8 = L"I8AddSaturateU";
    break;
  case 0xfd91:
    pcVar8 = L"I8Sub";
    break;
  case 0xfd92:
    pcVar8 = L"I8SubSaturateS";
    break;
  case 0xfd93:
    pcVar8 = L"I8SubSaturateU";
    break;
  case 0xfd95:
    pcVar8 = L"I8Mul";
    break;
  case 0xfda1:
    pcVar8 = L"I4Neg";
    break;
  case 0xfda2:
    pcVar8 = L"I4AnyTrue";
    break;
  case 0xfda3:
    pcVar8 = L"I4AllTrue";
    break;
  case 0xfdab:
    pcVar8 = L"I4Shl";
    break;
  case 0xfdac:
    pcVar8 = L"I4ShrS";
    break;
  case 0xfdad:
    pcVar8 = L"I4ShrU";
    break;
  case 0xfdae:
    pcVar8 = L"I4Add";
    break;
  case 0xfdb1:
    pcVar8 = L"I4Sub";
    break;
  case 0xfdb5:
    pcVar8 = L"I4Mul";
    break;
  case 0xfdc1:
    pcVar8 = L"I2Neg";
    break;
  case 0xfdcb:
    pcVar8 = L"I2Shl";
    break;
  case 0xfdcc:
    pcVar8 = L"I2ShrS";
    break;
  case 0xfdcd:
    pcVar8 = L"I2ShrU";
    break;
  case 0xfdce:
    pcVar8 = L"I2Add";
    break;
  case 0xfdd1:
    pcVar8 = L"I2Sub";
    break;
  case 0xfde0:
    pcVar8 = L"F4Abs";
    break;
  case 0xfde1:
    pcVar8 = L"F4Neg";
    break;
  case 0xfde3:
    pcVar8 = L"F4Sqrt";
    break;
  case 0xfde4:
    pcVar8 = L"F4Add";
    break;
  case 0xfde5:
    pcVar8 = L"F4Sub";
    break;
  case 0xfde6:
    pcVar8 = L"F4Mul";
    break;
  case 64999:
    pcVar8 = L"F4Div";
    break;
  case 65000:
    pcVar8 = L"F4Min";
    break;
  case 0xfde9:
    pcVar8 = L"F4Max";
    break;
  case 0xfdec:
    pcVar8 = L"F2Abs";
    break;
  case 0xfded:
    pcVar8 = L"F2Neg";
    break;
  case 0xfdef:
    pcVar8 = L"F2Sqrt";
    break;
  case 0xfdf0:
    pcVar8 = L"F2Add";
    break;
  case 0xfdf1:
    pcVar8 = L"F2Sub";
    break;
  case 0xfdf2:
    pcVar8 = L"F2Mul";
    break;
  case 0xfdf3:
    pcVar8 = L"F2Div";
    break;
  case 0xfdf4:
    pcVar8 = L"F2Min";
    break;
  case 0xfdf5:
    pcVar8 = L"F2Max";
    break;
  case 0xfdf8:
    pcVar8 = L"I4TruncS";
    break;
  case 0xfdf9:
    pcVar8 = L"I4TruncU";
    break;
  case 0xfdfa:
    pcVar8 = L"F4ConvertS";
    break;
  case 0xfdfb:
    pcVar8 = L"F4ConvertU";
    break;
  case 0xfe10:
    pcVar8 = L"I32AtomicLoad";
    goto LAB_00f1a7df;
  case 0xfe11:
    pcVar8 = L"I64AtomicLoad";
    goto LAB_00f1a7df;
  case 0xfe12:
    pcVar8 = L"I32AtomicLoad8U";
    goto LAB_00f1a7df;
  case 0xfe13:
    pcVar8 = L"I32AtomicLoad16U";
    goto LAB_00f1a7df;
  case 0xfe14:
    pcVar8 = L"I64AtomicLoad8U";
    goto LAB_00f1a7df;
  case 0xfe15:
    pcVar8 = L"I64AtomicLoad16U";
    goto LAB_00f1a7df;
  case 0xfe16:
    pcVar8 = L"I64AtomicLoad32U";
    goto LAB_00f1a7df;
  case 0xfe17:
    pcVar8 = L"I32AtomicStore";
    goto LAB_00f1a7df;
  case 0xfe18:
    pcVar8 = L"I64AtomicStore";
    goto LAB_00f1a7df;
  case 0xfe19:
    pcVar8 = L"I32AtomicStore8";
    goto LAB_00f1a7df;
  case 0xfe1a:
    pcVar8 = L"I32AtomicStore16";
    goto LAB_00f1a7df;
  case 0xfe1b:
    pcVar8 = L"I64AtomicStore8";
    goto LAB_00f1a7df;
  case 0xfe1c:
    pcVar8 = L"I64AtomicStore16";
    goto LAB_00f1a7df;
  case 0xfe1d:
    pcVar8 = L"I64AtomicStore32";
    goto LAB_00f1a7df;
  case 0xfe1e:
    pcVar8 = L"I32AtomicRmwAdd";
    goto LAB_00f1a7df;
  case 0xfe1f:
    pcVar8 = L"I64AtomicRmwAdd";
    goto LAB_00f1a7df;
  case 0xfe20:
    pcVar8 = L"I32AtomicRmw8UAdd";
    goto LAB_00f1a7df;
  case 0xfe21:
    pcVar8 = L"I32AtomicRmw16UAdd";
    goto LAB_00f1a7df;
  case 0xfe22:
    pcVar8 = L"I64AtomicRmw8UAdd";
    goto LAB_00f1a7df;
  case 0xfe23:
    pcVar8 = L"I64AtomicRmw16UAdd";
    goto LAB_00f1a7df;
  case 0xfe24:
    pcVar8 = L"I64AtomicRmw32UAdd";
    goto LAB_00f1a7df;
  case 0xfe25:
    pcVar8 = L"I32AtomicRmwSub";
    goto LAB_00f1a7df;
  case 0xfe26:
    pcVar8 = L"I64AtomicRmwSub";
    goto LAB_00f1a7df;
  case 0xfe27:
    pcVar8 = L"I32AtomicRmw8USub";
    goto LAB_00f1a7df;
  case 0xfe28:
    pcVar8 = L"I32AtomicRmw16USub";
    goto LAB_00f1a7df;
  case 0xfe29:
    pcVar8 = L"I64AtomicRmw8USub";
    goto LAB_00f1a7df;
  case 0xfe2a:
    pcVar8 = L"I64AtomicRmw16USub";
    goto LAB_00f1a7df;
  case 0xfe2b:
    pcVar8 = L"I64AtomicRmw32USub";
    goto LAB_00f1a7df;
  case 0xfe2c:
    pcVar8 = L"I32AtomicRmwAnd";
    goto LAB_00f1a7df;
  case 0xfe2d:
    pcVar8 = L"I64AtomicRmwAnd";
    goto LAB_00f1a7df;
  case 0xfe2e:
    pcVar8 = L"I32AtomicRmw8UAnd";
    goto LAB_00f1a7df;
  case 0xfe2f:
    pcVar8 = L"I32AtomicRmw16UAnd";
    goto LAB_00f1a7df;
  case 0xfe30:
    pcVar8 = L"I64AtomicRmw8UAnd";
    goto LAB_00f1a7df;
  case 0xfe31:
    pcVar8 = L"I64AtomicRmw16UAnd";
    goto LAB_00f1a7df;
  case 0xfe32:
    pcVar8 = L"I64AtomicRmw32UAnd";
    goto LAB_00f1a7df;
  case 0xfe33:
    pcVar8 = L"I32AtomicRmwOr";
    goto LAB_00f1a7df;
  case 0xfe34:
    pcVar8 = L"I64AtomicRmwOr";
    goto LAB_00f1a7df;
  case 0xfe35:
    pcVar8 = L"I32AtomicRmw8UOr";
    goto LAB_00f1a7df;
  case 0xfe36:
    pcVar8 = L"I32AtomicRmw16UOr";
    goto LAB_00f1a7df;
  case 0xfe37:
    pcVar8 = L"I64AtomicRmw8UOr";
    goto LAB_00f1a7df;
  case 0xfe38:
    pcVar8 = L"I64AtomicRmw16UOr";
    goto LAB_00f1a7df;
  case 0xfe39:
    pcVar8 = L"I64AtomicRmw32UOr";
    goto LAB_00f1a7df;
  case 0xfe3a:
    pcVar8 = L"I32AtomicRmwXor";
    goto LAB_00f1a7df;
  case 0xfe3b:
    pcVar8 = L"I64AtomicRmwXor";
    goto LAB_00f1a7df;
  case 0xfe3c:
    pcVar8 = L"I32AtomicRmw8UXor";
    goto LAB_00f1a7df;
  case 0xfe3d:
    pcVar8 = L"I32AtomicRmw16UXor";
    goto LAB_00f1a7df;
  case 0xfe3e:
    pcVar8 = L"I64AtomicRmw8UXor";
    goto LAB_00f1a7df;
  case 0xfe3f:
    pcVar8 = L"I64AtomicRmw16UXor";
    goto LAB_00f1a7df;
  case 0xfe40:
    pcVar8 = L"I64AtomicRmw32UXor";
    goto LAB_00f1a7df;
  case 0xfe41:
    pcVar8 = L"I32AtomicRmwXchg";
    goto LAB_00f1a7df;
  case 0xfe42:
    pcVar8 = L"I64AtomicRmwXchg";
    goto LAB_00f1a7df;
  case 0xfe43:
    pcVar8 = L"I32AtomicRmw8UXchg";
    goto LAB_00f1a7df;
  case 0xfe44:
    pcVar8 = L"I32AtomicRmw16UXchg";
    goto LAB_00f1a7df;
  case 0xfe45:
    pcVar8 = L"I64AtomicRmw8UXchg";
    goto LAB_00f1a7df;
  case 0xfe46:
    pcVar8 = L"I64AtomicRmw16UXchg";
    goto LAB_00f1a7df;
  case 0xfe47:
    pcVar8 = L"I64AtomicRmw32UXchg";
    goto LAB_00f1a7df;
  case 0xfe48:
    pcVar8 = L"I32AtomicRmwCmpxchg";
    goto LAB_00f1a7df;
  case 0xfe49:
    pcVar8 = L"I64AtomicRmwCmpxchg";
    goto LAB_00f1a7df;
  case 0xfe4a:
    pcVar8 = L"I32AtomicRmw8UCmpxchg";
    goto LAB_00f1a7df;
  case 0xfe4b:
    pcVar8 = L"I32AtomicRmw16UCmpxchg";
    goto LAB_00f1a7df;
  case 0xfe4c:
    pcVar8 = L"I64AtomicRmw8UCmpxchg";
    goto LAB_00f1a7df;
  case 0xfe4d:
    pcVar8 = L"I64AtomicRmw16UCmpxchg";
    goto LAB_00f1a7df;
  case 0xfe4e:
    pcVar8 = L"I64AtomicRmw32UCmpxchg";
LAB_00f1a7df:
    Output::Print(pcVar8);
switchD_00f1aa73_caseD_28:
    pWVar5 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar5 == (WasmBinaryReader *)0x0) {
      pWVar5 = (this->m_module->m_reader).ptr;
    }
    (*(code *)(&DAT_011c8814 +
              *(int *)(&DAT_011c8814 +
                      (ulong)((uint)((pWVar5->super_WasmReaderBase).m_currentNode.field_1.brTable.
                                     numTargets != 0) +
                             (uint)((pWVar5->super_WasmReaderBase).m_currentNode.field_1.mem.
                                    alignment != '\0') * 2) * 4)))();
    return;
  }
LAB_00f1a834:
  Output::Print(pcVar8);
switchD_00f1aa73_caseD_f:
  Output::SkipToColumn(0x28);
  PrintTypeStack(this);
  return;
}

Assistant:

void WasmBytecodeGenerator::PrintOpBegin(WasmOp op)
{
    if (lastOpId == opId) Output::Print(_u("\r\n"));
    lastOpId = ++opId;
    const int depth = m_blockInfos.Count() - 1;
    if (depth > 0)
    {
        Output::SkipToColumn(depth);
    }
    const auto PrintSignature = [this](uint32 sigId)
    {
        if (sigId < m_module->GetSignatureCount())
        {
            Output::Print(_u(" "));
            WasmSignature* sig = m_module->GetSignature(sigId);
            sig->Dump(64);
        }
        else
        {
            Output::Print(_u(" invalid signature id %u"), sigId);
        }
    };

    switch (op)
    {
#define WASM_OPCODE(opname, ...) \
case wb##opname: \
    Output::Print(_u(#opname)); \
    break;
#include "WasmBinaryOpCodes.h"
    }
    switch (op)
    {
    case wbIf:
    case wbLoop:
    case wbBlock: 
        if (GetReader()->m_currentNode.block.IsSingleResult())
        {
            Output::Print(_u(" () -> %s"), GetTypeName(GetReader()->m_currentNode.block.GetSingleResult()));
        }
        else
        {
            PrintSignature(GetReader()->m_currentNode.block.GetSignatureId()); break;
        }
        break;
    case wbBr:
    case wbBrIf: Output::Print(_u(" depth: %u"), GetReader()->m_currentNode.br.depth); break;
    case wbBrTable: Output::Print(_u(" %u cases, default: %u"), GetReader()->m_currentNode.brTable.numTargets, GetReader()->m_currentNode.brTable.defaultTarget); break;
    case wbCallIndirect: PrintSignature(GetReader()->m_currentNode.call.num); break;
    case wbCall:
    {
        uint32 id = GetReader()->m_currentNode.call.num;
        if (id < m_module->GetWasmFunctionCount())
        {
            FunctionIndexTypes::Type funcType = GetReader()->m_currentNode.call.funcType;
            switch (funcType)
            {
            case Wasm::FunctionIndexTypes::Invalid: Output::Print(_u(" (invalid) ")); break;
            case Wasm::FunctionIndexTypes::ImportThunk: Output::Print(_u(" (thunk) ")); break;
            case Wasm::FunctionIndexTypes::Function: Output::Print(_u(" (func) ")); break;
            case Wasm::FunctionIndexTypes::Import: Output::Print(_u(" (import) ")); break;
            default:  Output::Print(_u(" (unknown)")); break;
            }
            auto func = this->m_module->GetWasmFunctionInfo(id);
            func->GetBody()->DumpFullFunctionName();
        }
        else
        {
            Output::Print(_u(" invalid id %u"), id);
        }
        break;
    }
    case wbSetLocal:
    case wbGetLocal:
    case wbTeeLocal:
    case wbGetGlobal:
    case wbSetGlobal: Output::Print(_u(" (%d)"), GetReader()->m_currentNode.var.num); break;
    case wbI32Const: Output::Print(_u(" (%d, 0x%x)"), GetReader()->m_currentNode.cnst.i32, GetReader()->m_currentNode.cnst.i32); break;
    case wbI64Const: Output::Print(_u(" (%lld, 0x%llx)"), GetReader()->m_currentNode.cnst.i64, GetReader()->m_currentNode.cnst.i64); break;
    case wbF32Const: Output::Print(_u(" (%.4f)"), GetReader()->m_currentNode.cnst.f32); break;
    case wbF64Const: Output::Print(_u(" (%.4f)"), GetReader()->m_currentNode.cnst.f64); break;
#define WASM_MEM_OPCODE(opname, ...) case wb##opname: // FallThrough
#include "WasmBinaryOpCodes.h"
    {
        const uint8 alignment = GetReader()->m_currentNode.mem.alignment;
        const uint32 offset = GetReader()->m_currentNode.mem.offset;
        switch (((!!alignment) << 1) | (!!offset))
        {
        case 0: // no alignment, no offset
            Output::Print(_u(" [i]")); break;
        case 1: // no alignment, offset
            Output::Print(_u(" [i + %u (0x%x)]"), offset, offset); break;
        case 2: // alignment, no offset
            Output::Print(_u(" [i & ~0x%x]"), (1 << alignment) - 1); break;
        case 3: // alignment, offset
            Output::Print(_u(" [i + %u (0x%x) & ~0x%x]"), offset, offset, (1 << alignment) - 1); break;
        }
        break;
    }
    }
    Output::SkipToColumn(40);
    PrintTypeStack();
}